

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_resume(HSQUIRRELVM v,SQBool retval,SQBool raiseerror)

{
  SQInteger stackbase;
  bool bVar1;
  SQObjectPtr *pSVar2;
  SQObjectPtr *outres;
  SQBool raiseerror_local;
  SQBool retval_local;
  HSQUIRRELVM v_local;
  
  pSVar2 = SQVM::GetUp(v,-1);
  if ((pSVar2->super_SQObject)._type == OT_GENERATOR) {
    SQVM::PushNull(v);
    pSVar2 = SQVM::GetUp(v,-2);
    stackbase = v->_top;
    outres = SQVM::GetUp(v,-1);
    bVar1 = SQVM::Execute(v,pSVar2,0,stackbase,outres,raiseerror,ET_RESUME_GENERATOR);
    if (bVar1) {
      if (retval == 0) {
        SQVM::Pop(v);
      }
      v_local = (HSQUIRRELVM)0x0;
    }
    else {
      SQVM::Raise_Error(v,&v->_lasterror);
      v_local = (HSQUIRRELVM)0xffffffffffffffff;
    }
  }
  else {
    v_local = (HSQUIRRELVM)sq_throwerror(v,"only generators can be resumed");
  }
  return (SQRESULT)v_local;
}

Assistant:

SQRESULT sq_resume(HSQUIRRELVM v,SQBool retval,SQBool raiseerror)
{
    if (type(v->GetUp(-1)) == OT_GENERATOR)
    {
        v->PushNull(); //retval
        if (!v->Execute(v->GetUp(-2), 0, v->_top, v->GetUp(-1), raiseerror, SQVM::ET_RESUME_GENERATOR))
        {v->Raise_Error(v->_lasterror); return SQ_ERROR;}
        if(!retval)
            v->Pop();
        return SQ_OK;
    }
    return sq_throwerror(v,_SC("only generators can be resumed"));
}